

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_list.hpp
# Opt level: O1

pair<std::_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>,_std::_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>_>
* __thiscall
libtorrent::aux::peer_list::find_peers
          (pair<std::_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>,_std::_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>_>
           *__return_storage_ptr__,peer_list *this,address *a)

{
  _Elt_pointer pptVar1;
  _Elt_pointer pptVar2;
  _Elt_pointer pptVar3;
  _Map_pointer ppptVar4;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  
  if ((a->ipv4_address_).addr_.s_addr == 0 && a->type_ == ipv4) {
    pptVar1 = (this->m_peers).
              super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
              .
              super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    pptVar2 = (this->m_peers).
              super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
              .
              super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first;
    pptVar3 = (this->m_peers).
              super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
              .
              super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_last;
    ppptVar4 = (this->m_peers).
               super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               .
               super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node;
    (__return_storage_ptr__->first)._M_cur = pptVar1;
    (__return_storage_ptr__->first)._M_first = pptVar2;
    (__return_storage_ptr__->first)._M_last = pptVar3;
    (__return_storage_ptr__->first)._M_node = ppptVar4;
    (__return_storage_ptr__->second)._M_cur = pptVar1;
    (__return_storage_ptr__->second)._M_first = pptVar2;
    (__return_storage_ptr__->second)._M_last = pptVar3;
    (__return_storage_ptr__->second)._M_node = ppptVar4;
  }
  else {
    local_28 = *(undefined4 *)
                &(this->m_peers).
                 super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 .
                 super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
    uStack_24 = *(undefined4 *)
                 ((long)&(this->m_peers).
                         super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                         .
                         super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                         ._M_impl.super__Deque_impl_data._M_start._M_cur + 4);
    uStack_20 = *(undefined4 *)
                 &(this->m_peers).
                  super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                  .
                  super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_first;
    uStack_1c = *(undefined4 *)
                 ((long)&(this->m_peers).
                         super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                         .
                         super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                         ._M_impl.super__Deque_impl_data._M_start._M_first + 4);
    local_18 = *(undefined4 *)
                &(this->m_peers).
                 super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 .
                 super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_last;
    uStack_14 = *(undefined4 *)
                 ((long)&(this->m_peers).
                         super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                         .
                         super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                         ._M_impl.super__Deque_impl_data._M_start._M_last + 4);
    uStack_10 = *(undefined4 *)
                 &(this->m_peers).
                  super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                  .
                  super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node;
    uStack_c = *(undefined4 *)
                ((long)&(this->m_peers).
                        super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                        .
                        super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_node + 4);
    local_48 = *(undefined4 *)
                &(this->m_peers).
                 super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 .
                 super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    uStack_44 = *(undefined4 *)
                 ((long)&(this->m_peers).
                         super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                         .
                         super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_cur + 4);
    uStack_40 = *(undefined4 *)
                 &(this->m_peers).
                  super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                  .
                  super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first;
    uStack_3c = *(undefined4 *)
                 ((long)&(this->m_peers).
                         super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                         .
                         super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_first + 4);
    local_38 = *(undefined4 *)
                &(this->m_peers).
                 super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 .
                 super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_last;
    uStack_34 = *(undefined4 *)
                 ((long)&(this->m_peers).
                         super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                         .
                         super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_last + 4);
    uStack_30 = *(undefined4 *)
                 &(this->m_peers).
                  super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                  .
                  super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node;
    uStack_2c = *(undefined4 *)
                 ((long)&(this->m_peers).
                         super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                         .
                         super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_node + 4);
    ::std::
    __equal_range<std::_Deque_iterator<libtorrent::aux::torrent_peer*,libtorrent::aux::torrent_peer*&,libtorrent::aux::torrent_peer**>,boost::asio::ip::address,__gnu_cxx::__ops::_Iter_comp_val<libtorrent::aux::peer_address_compare>,__gnu_cxx::__ops::_Val_comp_iter<libtorrent::aux::peer_address_compare>>
              (__return_storage_ptr__,&local_28,&local_48,a);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, iterator> find_peers(address const& a)
		{
#if TORRENT_USE_I2P
			if (a == address())
				return std::pair<iterator, iterator>(m_peers.end(), m_peers.end());
#endif
			return std::equal_range(
				m_peers.begin(), m_peers.end(), a, peer_address_compare());
		}